

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Face>::~Pool
          (Pool<btConvexHullInternal::Face> *this)

{
  long *in_RDI;
  PoolArray<btConvexHullInternal::Face> *p;
  
  while (*in_RDI != 0) {
    *in_RDI = *(long *)(*in_RDI + 0x10);
    PoolArray<btConvexHullInternal::Face>::~PoolArray
              ((PoolArray<btConvexHullInternal::Face> *)0x15337e);
    btAlignedFreeInternal((void *)0x153388);
  }
  return;
}

Assistant:

~Pool()
				{
					while (arrays)
					{
						PoolArray<T>* p = arrays;
						arrays = p->next;
						p->~PoolArray<T>();
						btAlignedFree(p);
					}
				}